

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O2

uint32_t x86_cpu_features(void)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  uint *in_RSI;
  uint in_EDI;
  
  uVar2 = __get_cpuid_max(in_EDI,in_RSI);
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    lVar1 = cpuid_Version_info(1);
    uVar3 = *(uint32_t *)(lVar1 + 0xc);
  }
  return uVar3;
}

Assistant:

static uint32_t x86_cpu_features(void) {
#ifdef __GNUC__
  uint32_t eax, ebx, ecx, edx;
  if (__get_cpuid_max(0, NULL) < 1)
    return 0;
  __cpuid_count(1, 0, eax, ebx, ecx, edx);
  return ecx;
#elif defined(_MSC_VER)
  int info[4];
  __cpuid(info, 0);
  if (info[0] < 1)
    return 0;
  __cpuidex(info, 1, 0);
  return info[2];
#else
  return 0;
#endif
}